

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImproperCosineInversionType.cpp
# Opt level: O2

void __thiscall
OpenMD::ImproperCosineInversionType::ImproperCosineInversionType
          (ImproperCosineInversionType *this,
          vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
          *parameters)

{
  _Rb_tree_header *p_Var1;
  int maxPower;
  __normal_iterator<OpenMD::ImproperCosineInversionParameter_*,_std::vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>_>
  _Var2;
  pointer pIVar3;
  double dVar4;
  DoublePolynomial finalPolynomial;
  ChebyshevU U;
  ChebyshevT T;
  DoublePolynomial sinTerm;
  DoublePolynomial cosTerm;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_170;
  ChebyshevU local_140;
  ChebyshevT local_118;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_f0;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_c0;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_60;
  
  p_Var1 = &(this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.
            super__Rb_tree_header;
  (this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (this->super_PolynomialInversionType).super_InversionType._vptr_InversionType =
       (_func_int **)&PTR__PolynomialInversionType_002c1360;
  _Var2 = std::
          __max_element<__gnu_cxx::__normal_iterator<OpenMD::ImproperCosineInversionParameter*,std::vector<OpenMD::ImproperCosineInversionParameter,std::allocator<OpenMD::ImproperCosineInversionParameter>>>,__gnu_cxx::__ops::_Iter_comp_iter<OpenMD::LessThanPeriodicityFunctor>>
                    ((parameters->
                     super__Vector_base<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (parameters->
                     super__Vector_base<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  if (_Var2._M_current !=
      (parameters->
      super__Vector_base<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    maxPower = (_Var2._M_current)->n;
    ChebyshevT::ChebyshevT(&local_118,maxPower);
    ChebyshevU::ChebyshevU(&local_140,maxPower);
    local_170._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_170._M_impl.super__Rb_tree_header._M_header;
    local_170._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_170._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_170._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_170._M_impl.super__Rb_tree_header._M_header._M_right =
         local_170._M_impl.super__Rb_tree_header._M_header._M_left;
    for (pIVar3 = (parameters->
                  super__Vector_base<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pIVar3 != (parameters->
                  super__Vector_base<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
                  )._M_impl.super__Vector_impl_data._M_finish; pIVar3 = pIVar3 + 1) {
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::_Rb_tree(&local_90,
                 (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                  *)(local_118.polyList_.
                     super__Vector_base<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + pIVar3->n));
      dVar4 = cos(pIVar3->delta);
      Polynomial<double>::operator*=((Polynomial<double> *)&local_90,dVar4 * pIVar3->kchi);
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::_Rb_tree(&local_c0,
                 (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                  *)(local_140.polyList_.
                     super__Vector_base<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + pIVar3->n));
      dVar4 = sin(pIVar3->delta);
      Polynomial<double>::operator*=((Polynomial<double> *)&local_c0,-dVar4 * pIVar3->kchi);
      OpenMD::operator+((Polynomial<double> *)&local_60,(Polynomial<double> *)&local_90,
                        (Polynomial<double> *)&local_c0);
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::operator=(&local_170,&local_60);
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::~_Rb_tree(&local_60);
      Polynomial<double>::operator+=((Polynomial<double> *)&local_170,pIVar3->kchi);
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::~_Rb_tree(&local_c0);
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::~_Rb_tree(&local_90);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::_Rb_tree(&local_f0,&local_170);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::operator=((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                 *)&(this->super_PolynomialInversionType).polynomial_,&local_f0);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(&local_f0);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(&local_170);
    ChebyshevU::~ChebyshevU(&local_140);
    ChebyshevT::~ChebyshevT(&local_118);
  }
  return;
}

Assistant:

ImproperCosineInversionType::ImproperCosineInversionType(
      std::vector<ImproperCosineInversionParameter>& parameters) {
    std::vector<ImproperCosineInversionParameter>::iterator i;
    i = std::max_element(parameters.begin(), parameters.end(),
                         LessThanPeriodicityFunctor());
    if (i != parameters.end()) {
      int maxPower = i->n;
      ChebyshevT T(maxPower);
      ChebyshevU U(maxPower);

      // convert parameters of impropercosine type inversion into
      // PolynomialInversion's parameters
      DoublePolynomial finalPolynomial;
      for (i = parameters.begin(); i != parameters.end(); ++i) {
        DoublePolynomial cosTerm = T.getChebyshevPolynomial(i->n);
        cosTerm *= cos(i->delta) * i->kchi;
        DoublePolynomial sinTerm = U.getChebyshevPolynomial(i->n);
        sinTerm *= -sin(i->delta) * i->kchi;
        finalPolynomial = cosTerm + sinTerm;
        finalPolynomial += i->kchi;
      }
      this->setPolynomial(finalPolynomial);
    }
  }